

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::AssertionResult::getExpandedExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_resultData);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpandedExpression() const {
		return m_resultData.reconstructedExpression;
	}